

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O2

void __thiscall
nestl::impl::list<int,_nestl::allocator<int>_>::
assign_nothrow<nestl::has_exceptions::exception_ptr_error>
          (list<int,_nestl::allocator<int>_> *this,exception_ptr_error *err,size_type n,
          const_reference val)

{
  bool bVar1;
  long lVar2;
  list<int,_nestl::allocator<int>_> tmp;
  list<int,_nestl::allocator<int>_> lStack_38;
  
  lStack_38.m_node.m_next = &lStack_38.m_node;
  lStack_38.m_node.m_prev = lStack_38.m_node.m_next;
  list_node_base::swap(&this->m_node,lStack_38.m_node.m_next);
  lVar2 = n + 1;
  do {
    lVar2 = lVar2 + -1;
    if (lVar2 == 0) break;
    push_back_nothrow<nestl::has_exceptions::exception_ptr_error>(this,err,val);
    bVar1 = has_exceptions::exception_ptr_error::operator_cast_to_bool(err);
  } while (!bVar1);
  destroy_list_content(&lStack_38);
  return;
}

Assistant:

void
list<T, A>::assign_nothrow(OperationError& err, size_type n, const_reference val) NESTL_NOEXCEPT_SPEC
{
    list tmp; tmp.swap(*this);

    while (n > 0)
    {
        push_back_nothrow(err, val);
        if (err)
        {
            return;
        }

        --n;
    }
}